

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidatePopElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  ulong uVar1;
  xmlValidState *pxVar2;
  xmlElementPtr pxVar3;
  int iVar4;
  long lVar5;
  xmlValidState *pxVar6;
  int iVar7;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 1;
    if ((0 < ctxt->vstateNr) && (pxVar2 = ctxt->vstate, pxVar2 != (xmlValidState *)0x0)) {
      if ((pxVar2->elemDecl != (xmlElementPtr)0x0) &&
         ((pxVar2->elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT &&
          (pxVar2->exec != (xmlRegExecCtxtPtr)0x0)))) {
        iVar4 = xmlRegExecPushString(pxVar2->exec,(xmlChar *)0x0,(void *)0x0);
        if (iVar4 < 1) {
          if (iVar4 == -5) {
            xmlVErrMemory(ctxt);
          }
          iVar7 = 0;
        }
      }
      lVar5 = (long)ctxt->vstateNr;
      if (0 < lVar5) {
        uVar1 = lVar5 - 1;
        ctxt->vstateNr = (int)uVar1;
        pxVar2 = ctxt->vstateTab;
        pxVar3 = pxVar2[uVar1 & 0xffffffff].elemDecl;
        pxVar2[uVar1 & 0xffffffff].elemDecl = (xmlElementPtr)0x0;
        pxVar2[lVar5 + -1].node = (xmlNodePtr)0x0;
        if ((pxVar3 != (xmlElementPtr)0x0) && (pxVar3->etype == XML_ELEMENT_TYPE_ELEMENT)) {
          xmlRegFreeExecCtxt(pxVar2[uVar1].exec);
        }
        pxVar2 = ctxt->vstateTab;
        iVar4 = ctxt->vstateNr;
        (pxVar2 + (long)iVar4 + -1)[1].exec = (xmlRegExecCtxtPtr)0x0;
        pxVar6 = (xmlValidState *)0x0;
        if (0 < (long)iVar4) {
          pxVar6 = pxVar2 + (long)iVar4 + -1;
        }
        ctxt->vstate = pxVar6;
      }
    }
  }
  return iVar7;
}

Assistant:

int
xmlValidatePopElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc ATTRIBUTE_UNUSED,
                      xmlNodePtr elem ATTRIBUTE_UNUSED,
		      const xmlChar *qname ATTRIBUTE_UNUSED) {
    int ret = 1;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    if (elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT) {
		if (state->exec != NULL) {
		    ret = xmlRegExecPushString(state->exec, NULL, NULL);
		    if (ret <= 0) {
                        if (ret == XML_REGEXP_OUT_OF_MEMORY)
                            xmlVErrMemory(ctxt);
			ret = 0;
		    } else {
			/*
			 * previous validation errors should not generate
			 * a new one here
			 */
			ret = 1;
		    }
		}
	    }
	}
	vstateVPop(ctxt);
    }
    return(ret);
}